

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputVariableTest::getBufferDescriptors
          (XFBCaptureInactiveOutputVariableTest *this,GLuint param_1,Vector *out_descriptors)

{
  pointer pbVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer this_00;
  ulong uVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::resize(out_descriptors,2);
  pbVar1 = (out_descriptors->
           super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1->m_index = 0;
  pbVar1->m_target = Uniform;
  pbVar1[1].m_index = 0;
  pbVar1[1].m_target = Transform_feedback;
  Utils::Type::GenerateData(&local_60,(Type *)&Utils::Type::vec4);
  Utils::Type::GenerateData(&local_48,(Type *)&Utils::Type::vec4);
  uVar6 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  iVar2 = (int)uVar6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pbVar1->m_initial_data,(ulong)(uint)(iVar2 * 2));
  uVar6 = uVar6 & 0xffffffff;
  memcpy((pbVar1->m_initial_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start,
         local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,uVar6);
  memcpy((void *)(*(long *)&(pbVar1->m_initial_data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + uVar6),
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,uVar6);
  uVar3 = iVar2 * 3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pbVar1[1].m_initial_data,(ulong)uVar3);
  this_00 = pbVar1 + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this_00->m_expected_data,(ulong)uVar3);
  if (iVar2 != 0) {
    uVar4 = 1;
    if (1 < uVar3) {
      uVar4 = (ulong)uVar3;
    }
    uVar5 = 0;
    do {
      pbVar1[1].m_initial_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5] = (uchar)uVar5;
      (this_00->m_expected_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5] = (uchar)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  memcpy((this_00->m_expected_data).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + (uint)(iVar2 * 2),
         local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,uVar6);
  memcpy((this_00->m_expected_data).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,uVar6);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void XFBCaptureInactiveOutputVariableTest::getBufferDescriptors(glw::GLuint /* test_case_index */,
																bufferDescriptor::Vector& out_descriptors)
{
	const Utils::Type& type = Utils::Type::vec4;

	/* Test needs single uniform and xfb */
	out_descriptors.resize(2);

	/* Get references */
	bufferDescriptor& uniform = out_descriptors[0];
	bufferDescriptor& xfb	 = out_descriptors[1];

	/* Index */
	uniform.m_index = 0;
	xfb.m_index		= 0;

	/* Target */
	uniform.m_target = Utils::Buffer::Uniform;
	xfb.m_target	 = Utils::Buffer::Transform_feedback;

	/* Data */
	const std::vector<GLubyte>& gohan_data = type.GenerateData();
	const std::vector<GLubyte>& goten_data = type.GenerateData();

	const GLuint type_size = static_cast<GLuint>(gohan_data.size());

	/* Uniform data */
	uniform.m_initial_data.resize(2 * type_size);
	memcpy(&uniform.m_initial_data[0] + 0, &gohan_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + type_size, &goten_data[0], type_size);

	/* XFB data */
	xfb.m_initial_data.resize(3 * type_size);
	xfb.m_expected_data.resize(3 * type_size);

	for (GLuint i = 0; i < 3 * type_size; ++i)
	{
		xfb.m_initial_data[i]  = (glw::GLubyte)i;
		xfb.m_expected_data[i] = (glw::GLubyte)i;
	}

	memcpy(&xfb.m_expected_data[0] + 2 * type_size, &gohan_data[0], type_size);
	memcpy(&xfb.m_expected_data[0] + 0 * type_size, &goten_data[0], type_size);
}